

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

char * glslang::TQualifier::getLayoutStencilString(TLayoutStencil s)

{
  if (s - ElsRefUnchangedFrontAMD < 6) {
    return &DAT_0063c9c0 + *(int *)(&DAT_0063c9c0 + (ulong)(s - ElsRefUnchangedFrontAMD) * 4);
  }
  return "none";
}

Assistant:

static const char* getLayoutStencilString(TLayoutStencil s)
    {
        switch (s) {
        case ElsRefUnchangedFrontAMD: return "stencil_ref_unchanged_front_amd";
        case ElsRefGreaterFrontAMD:   return "stencil_ref_greater_front_amd";
        case ElsRefLessFrontAMD:      return "stencil_ref_less_front_amd";
        case ElsRefUnchangedBackAMD:  return "stencil_ref_unchanged_back_amd";
        case ElsRefGreaterBackAMD:    return "stencil_ref_greater_back_amd";
        case ElsRefLessBackAMD:       return "stencil_ref_less_back_amd";
        default:                      return "none";
        }
    }